

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

void __thiscall
btHashMap<btHashPtr,_btCollisionShape_*>::clear(btHashMap<btHashPtr,_btCollisionShape_*> *this)

{
  btAlignedObjectArray<int>::clear(&this->m_hashTable);
  btAlignedObjectArray<int>::clear(&this->m_next);
  btAlignedObjectArray<btCollisionShape_*>::clear(&this->m_valueArray);
  btAlignedObjectArray<btHashPtr>::clear(&this->m_keyArray);
  return;
}

Assistant:

void	clear()
	{
		m_hashTable.clear();
		m_next.clear();
		m_valueArray.clear();
		m_keyArray.clear();
	}